

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isRealTable(Parse *pParse,Table *pTab,int bDrop)

{
  int in_EDX;
  char *pcVar1;
  undefined8 *in_RSI;
  Parse *in_RDI;
  char *zType;
  char *local_28;
  int local_4;
  
  local_28 = (char *)0x0;
  if (*(char *)((long)in_RSI + 0x3f) == '\x02') {
    local_28 = "view";
  }
  if (*(char *)((long)in_RSI + 0x3f) == '\x01') {
    local_28 = "virtual table";
  }
  if (local_28 == (char *)0x0) {
    local_4 = 0;
  }
  else {
    pcVar1 = "rename columns of";
    if (in_EDX != 0) {
      pcVar1 = "drop column from";
    }
    sqlite3ErrorMsg(in_RDI,"cannot %s %s \"%s\"",pcVar1,local_28,*in_RSI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int isRealTable(Parse *pParse, Table *pTab, int bDrop){
  const char *zType = 0;
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    zType = "view";
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    zType = "virtual table";
  }
#endif
  if( zType ){
    sqlite3ErrorMsg(pParse, "cannot %s %s \"%s\"",
        (bDrop ? "drop column from" : "rename columns of"),
        zType, pTab->zName
    );
    return 1;
  }
  return 0;
}